

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Endpoints.cpp
# Opt level: O0

ssize_t __thiscall
helics::Endpoint::send(Endpoint *this,int __fd,void *__buf,size_t __n,int __flags)

{
  string_view message;
  Modes MVar1;
  bool bVar2;
  ssize_t extraout_RAX;
  undefined8 uVar3;
  undefined4 in_register_00000034;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  Core *pCVar5;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffa0;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *this_00;
  size_t in_stack_ffffffffffffffa8;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> local_20;
  uint local_14;
  char *local_10;
  Endpoint *local_8;
  
  pcVar4 = (char *)CONCAT44(in_register_00000034,__fd);
  local_10 = pcVar4;
  local_8 = this;
  MVar1 = Federate::getCurrentMode((Federate *)0x322f1d);
  if ((MVar1 != EXECUTING) &&
     (MVar1 = Federate::getCurrentMode((Federate *)0x322f36), MVar1 != INITIALIZING)) {
    uVar3 = __cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    message._M_str = pcVar4;
    message._M_len = in_stack_ffffffffffffffa8;
    InvalidFunctionCall::InvalidFunctionCall
              ((InvalidFunctionCall *)in_stack_ffffffffffffffa0,message);
    __cxa_throw(uVar3,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
  }
  CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
            ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x322f48);
  bVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x322f54);
  if (bVar2) {
    CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x322f72);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  pCVar5 = (this->super_Interface).mCore;
  local_14 = (this->super_Interface).handle.hid;
  this_00 = &local_20;
  CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::unique_ptr
            ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
             in_stack_ffffffffffffff90,
             (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
             in_stack_ffffffffffffff88);
  (*pCVar5->_vptr_Core[0x4e])(pCVar5,(ulong)local_14,this_00);
  CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr(this_00)
  ;
  return extraout_RAX;
}

Assistant:

void Endpoint::send(std::unique_ptr<Message> mess) const
{
    if ((fed->getCurrentMode() == Federate::Modes::EXECUTING) ||
        (fed->getCurrentMode() == Federate::Modes::INITIALIZING)) {
        if (mess->dest.empty()) {
            mess->dest = defDest;
        }
        mCore->sendMessage(handle, std::move(mess));
    } else {
        throw(InvalidFunctionCall(
            "messages not allowed outside of execution and initialization mode"));
    }
}